

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::ComputeOutput(Renderer *this,float *buffer,int count)

{
  sample_t *psVar1;
  int i;
  int iVar2;
  Voice *v;
  
  if (0 < count) {
    v = this->voice;
    memset(buffer,0,(ulong)(uint)count << 3);
    iVar2 = 0;
    if (this->resample_buffer_size < count) {
      this->resample_buffer_size = count;
      psVar1 = (sample_t *)
               M_Realloc_Dbg(this->resample_buffer,(ulong)(uint)count << 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/timidity/timidity.cpp"
                             ,0x2e7);
      this->resample_buffer = psVar1;
      iVar2 = 0;
    }
    for (; iVar2 < this->voices; iVar2 = iVar2 + 1) {
      if ((v->status & 1) != 0) {
        mix_voice(this,buffer,v,count);
      }
      v = v + 1;
    }
  }
  return;
}

Assistant:

void Renderer::ComputeOutput(float *buffer, int count)
{
	// count is in samples, not bytes.
	if (count <= 0)
	{
		return;
	}
	Voice *v = &voice[0];

	memset(buffer, 0, sizeof(float)*count*2);		// An integer 0 is also a float 0.
	if (resample_buffer_size < count)
	{
		resample_buffer_size = count;
		resample_buffer = (sample_t *)M_Realloc(resample_buffer, count * sizeof(float) * 2);
	}
	for (int i = 0; i < voices; i++, v++)
	{
		if (v->status & VOICE_RUNNING)
		{
			mix_voice(this, buffer, v, count);
		}
	}
}